

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.h
# Opt level: O1

shared_ptr<cppcms::application_specific_pool> __thiscall
cppcms::create_pool<sender,pools*>(cppcms *this,pools *p)

{
  simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
  *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppcms::application_specific_pool> sVar1;
  
  __p = (simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
         *)operator_new(0x30);
  cppcms::application_specific_pool::application_specific_pool((application_specific_pool *)__p);
  *(undefined ***)__p = &PTR__application_specific_pool_00112c30;
  (__p->call_)._M_f = details::create_app<sender,pools*>;
  (__p->call_)._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_pools_*>.
  super__Tuple_impl<1UL,_pools_*>.super__Head_base<1UL,_pools_*,_false>._M_head_impl = p;
  *(simple_application_specific_pool1<sender,_std::_Bind<sender_*(*(std::_Placeholder<1>,_pools_*))(cppcms::service_&,_pools_*)>_>
    **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppcms::details::simple_application_specific_pool1<sender,std::_Bind<sender*(*(std::_Placeholder<1>,pools*))(cppcms::service&,pools*)>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cppcms::details::simple_application_specific_pool1<sender,std::_Bind<sender*(*(std::_Placeholder<1>,pools*))(cppcms::service&,pools*)>>,cppcms::details::simple_application_specific_pool1<sender,std::_Bind<sender*(*(std::_Placeholder<1>,pools*))(cppcms::service&,pools*)>>>
            ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)this,__p)
  ;
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppcms::application_specific_pool>)
         sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<application_specific_pool> create_pool(P...p)
	{
        auto functor = std::bind(&details::create_app<T,P...>,std::placeholders::_1,p...);
        typedef details::simple_application_specific_pool1<T,decltype(functor)> pool_type;
		booster::shared_ptr<application_specific_pool> f(new pool_type(std::move(functor)));
		return f;
	}